

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool mjs::is_assignment_op(token_type t)

{
  bool local_9;
  token_type t_local;
  
  if (((t == rshiftshiftequal) || (t - lshiftequal < 2)) || (t - plusequal < 9)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool is_assignment_op(token_type t) {
    switch (t) {
    case token_type::equal:
    case token_type::plusequal:
    case token_type::minusequal:
    case token_type::multiplyequal:
    case token_type::divideequal:
    case token_type::modequal:
    case token_type::lshiftequal:
    case token_type::rshiftequal:
    case token_type::rshiftshiftequal:
    case token_type::andequal:
    case token_type::orequal:
    case token_type::xorequal:
        return true;
    default:
        return false;
    }
}